

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool __thiscall Divide<5,_1,_4>::propagate(Divide<5,_1,_4> *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  IntVar *pIVar11;
  IntVar *pIVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  
  pIVar12 = (this->x).var;
  pIVar11 = (this->y).var;
  lVar15 = (long)(this->x).b;
  iVar5 = (pIVar12->min).v;
  iVar1 = (pIVar11->max).v;
  lVar16 = (long)(pIVar11->min).v;
  pIVar11 = (this->z).var;
  lVar10 = (long)(this->z).b;
  lVar14 = (pIVar11->min).v + lVar10;
  lVar13 = (pIVar11->max).v + lVar10;
  lVar18 = ~(long)(pIVar12->max).v + lVar15;
  lVar17 = -lVar16;
  lVar6 = (lVar18 - lVar16) / lVar17;
  lVar16 = lVar13;
  if (lVar14 < lVar6) {
    if (so.lazy) {
      iVar3 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[9])(pIVar12);
      uVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      r._a = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
    }
    else {
      r._pt = (Clause *)0x0;
    }
    bVar2 = IntView<4>::setMin(&this->z,lVar6,(Reason)r,true);
    if (!bVar2) {
      return false;
    }
    pIVar11 = (this->z).var;
    lVar10 = (long)(this->z).b;
    lVar16 = (pIVar11->max).v + lVar10;
  }
  lVar15 = lVar15 - iVar5;
  lVar9 = -(long)iVar1;
  lVar6 = (lVar15 + lVar9 + -1) / lVar9;
  if (lVar6 < lVar16) {
    if (so.lazy == true) {
      iVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar7 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
      lVar10 = (long)(this->z).b;
      pIVar11 = (this->z).var;
    }
    else {
      uVar7 = 0;
    }
    iVar5 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar11,lVar6 - lVar10,uVar7,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
  }
  uVar7 = lVar9 * (lVar14 + -1);
  pIVar12 = (this->x).var;
  lVar16 = (long)(this->x).b;
  if (lVar16 - (pIVar12->max).v <= (long)uVar7) {
    if (so.lazy == true) {
      iVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar8 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
      lVar16 = (long)(this->x).b;
      pIVar12 = (this->x).var;
    }
    else {
      uVar8 = 0;
    }
    iVar5 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar12,lVar16 + ~uVar7,uVar8,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
    pIVar12 = (this->x).var;
    lVar16 = (long)(this->x).b;
  }
  lVar17 = lVar17 * lVar13;
  if (lVar17 < lVar16 - (pIVar12->min).v) {
    if (so.lazy == true) {
      iVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar7 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
      lVar16 = (long)(this->x).b;
      pIVar12 = (this->x).var;
    }
    else {
      uVar7 = 0;
    }
    iVar5 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar12,lVar16 - lVar17,uVar7,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
  }
  if (0 < lVar13) {
    lVar13 = (lVar18 + lVar13) / lVar13;
    pIVar12 = (this->y).var;
    lVar16 = (long)(pIVar12->max).v;
    lVar6 = -lVar16;
    if (lVar13 != lVar6 && SBORROW8(lVar13,lVar6) == lVar13 + lVar16 < 0) {
      if (so.lazy == true) {
        iVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar7 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
        pIVar12 = (this->y).var;
      }
      else {
        uVar7 = 0;
      }
      iVar5 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xf])(pIVar12,-lVar13,uVar7,1);
      if ((char)iVar5 == '\0') {
        return false;
      }
    }
  }
  if (lVar14 < 2) {
    return true;
  }
  lVar16 = (lVar15 + lVar14 + -2) / (lVar14 + -1);
  pIVar12 = (this->y).var;
  lVar6 = (long)(pIVar12->min).v;
  lVar13 = -lVar6;
  if (lVar16 == lVar13 || SBORROW8(lVar16,lVar13) != lVar16 + lVar6 < 0) {
    if (so.lazy == true) {
      iVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar7 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
      pIVar12 = (this->y).var;
    }
    else {
      uVar7 = 0;
    }
    iVar5 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xe])(pIVar12,1 - lVar16,uVar7,1)
    ;
    if ((char)iVar5 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= ceil(x.min / y.max)
		setDom(z, setMin, (x_min + y_max - 1) / y_max, x.getMinLit(), y.getMaxLit());
		// z <= ceil(x.max / y.min)
		setDom(z, setMax, (x_max + y_min - 1) / y_min, x.getMaxLit(), y.getMinLit());

		// x >= y.min * (z.min - 1) + 1
		setDom(x, setMin, y_min * (z_min - 1) + 1, y.getMinLit(), z.getMinLit());
		// x <= y.max * z.max
		setDom(x, setMax, y_max * z_max, y.getMaxLit(), z.getMaxLit());

		// y >= ceil(x.min / z.max)
		if (z_max >= 1) {
			setDom(y, setMin, (x_min + z_max - 1) / z_max, x.getMinLit(), z.getMaxLit());
		}

		// y <= ceil(x.max / z.min-1) - 1
		if (z_min >= 2) {
			setDom(y, setMax, (x_max + z_min - 2) / (z_min - 1) - 1, x.getMaxLit(), z.getMinLit());
		}

		return true;
	}